

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O1

int __thiscall
ncnn::InstanceNorm::forward_inplace(InstanceNorm *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  void *pvVar5;
  size_t sVar6;
  uint uVar7;
  void *pvVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar7 = bottom_top_blob->h * bottom_top_blob->w;
    pvVar8 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->cstep;
    iVar2 = this->affine;
    pvVar4 = (this->gamma_data).data;
    pvVar5 = (this->beta_data).data;
    uVar9 = (ulong)uVar7;
    sVar6 = bottom_top_blob->elemsize;
    lVar10 = 0;
    do {
      fVar13 = 0.0;
      fVar12 = 0.0;
      if (0 < (int)uVar7) {
        uVar11 = 0;
        do {
          fVar12 = fVar12 + *(float *)((long)pvVar8 + uVar11 * 4);
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
      fVar12 = fVar12 * (1.0 / (float)(int)uVar7);
      if (0 < (int)uVar7) {
        fVar13 = 0.0;
        uVar11 = 0;
        do {
          fVar14 = *(float *)((long)pvVar8 + uVar11 * 4) - fVar12;
          fVar13 = fVar13 + fVar14 * fVar14;
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
      fVar13 = fVar13 * (1.0 / (float)(int)uVar7);
      if (iVar2 == 0) {
        fVar13 = 1.0 / SQRT(fVar13 + this->eps);
        fVar12 = -fVar12 * fVar13;
      }
      else {
        fVar13 = *(float *)((long)pvVar4 + lVar10 * 4) / SQRT(fVar13 + this->eps);
        fVar12 = *(float *)((long)pvVar5 + lVar10 * 4) - fVar12 * fVar13;
      }
      if (0 < (int)uVar7) {
        uVar11 = 0;
        do {
          *(float *)((long)pvVar8 + uVar11 * 4) =
               *(float *)((long)pvVar8 + uVar11 * 4) * fVar13 + fVar12;
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
      lVar10 = lVar10 + 1;
      pvVar8 = (void *)((long)pvVar8 + sVar3 * sVar6);
    } while (lVar10 != iVar1);
  }
  return 0;
}

Assistant:

int InstanceNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / (sqrt(var + eps)) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int c = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < c; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        // mean and var
        float sum = 0.f;
        float sqsum = 0.f;
        for (int i = 0; i < size; i++)
        {
            sum += ptr[i];
            //sqsum += ptr[i] * ptr[i];
        }
        float mean = sum / size;
        float tmp = 0.f;
        for (int i = 0; i < size; i++)
        {
            tmp = ptr[i] - mean;
            sqsum += tmp * tmp;
        }
        float var = sqsum / size;
        // the var maybe minus due to accuracy
        //float var = sqsum / size - mean * mean;

        float a;
        float b;
        if (affine)
        {
            float gamma = gamma_data[q];
            float beta = beta_data[q];

            a = gamma / (sqrtf(var + eps));
            b = -mean * a + beta;
        }
        else
        {
            a = 1.f / (sqrtf(var + eps));
            b = -mean * a;
        }

        for (int i = 0; i < size; i++)
        {
            ptr[i] = ptr[i] * a + b;
        }
    }

    return 0;
}